

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_object.c
# Opt level: O2

void lu_clear_lhs(basiclu_object *obj)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar1 = obj->nzlhs;
  if (uVar1 != 0) {
    iVar3 = (int)obj->xstore[0x40];
    if ((int)((double)iVar3 * obj->xstore[0xc]) < (int)uVar1) {
      memset(obj->lhs,0,(long)iVar3 << 3);
    }
    else {
      uVar4 = 0;
      uVar2 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar2 = uVar4;
      }
      for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
        obj->lhs[obj->ilhs[uVar4]] = 0.0;
      }
    }
    obj->nzlhs = 0;
  }
  return;
}

Assistant:

static void lu_clear_lhs(struct basiclu_object *obj)
{
    lu_int m = obj->xstore[BASICLU_DIM];
    lu_int nzsparse = obj->xstore[BASICLU_SPARSE_THRESHOLD] * m;
    lu_int nz = obj->nzlhs;
    lu_int p;

    if (nz)
    {
        if (nz <= nzsparse)
            for (p = 0; p < nz; p++)
                obj->lhs[obj->ilhs[p]] = 0;
        else
            memset(obj->lhs, 0, m*sizeof(double));
        obj->nzlhs = 0;
    }
}